

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint version;
  int iVar2;
  long lVar3;
  FILE *pFVar4;
  void *pvVar5;
  anm_archive_t *paVar6;
  char *pcVar7;
  FILE *pFVar8;
  int *piVar9;
  char *pcVar10;
  list_node_t *plVar11;
  anm_entry_t *paVar12;
  list_node_t *plVar13;
  char *pcVar14;
  long lVar15;
  long *plVar16;
  int ind;
  list_t anms;
  char commands [21];
  FILE *local_70;
  int local_5c;
  list_t local_58;
  char local_48 [8];
  undefined5 uStack_40;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  
  g_anmmap = anmmap_new();
  atexit(free_globals);
  builtin_strncpy(local_48,":l:om:x:",8);
  uStack_40 = 0x633a723a58;
  uStack_3b = 0x3a733a;
  uStack_38 = 0x76756656;
  argv0 = util_shortname(*argv);
  local_5c = 0;
  if (argv[util_optind] == (char *)0x0) {
    *argv = (char *)0x0;
  }
  else {
    iVar2 = -1;
    local_70 = (FILE *)0x0;
    version = 0;
    do {
      iVar1 = util_getopt(argc,argv,local_48);
      switch(iVar1) {
      case 99:
        if (option_print_offsets == 0) goto switchD_0010ca03_caseD_6c;
LAB_0010cd07:
        pcVar14 = "%s: \'o\' option can\'t be used when creating ANM archive\n";
        goto LAB_0010cc0d;
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x74:
      case 0x77:
switchD_0010ca03_caseD_64:
        util_getopt_default(&local_5c,argv,iVar1,print_usage);
        break;
      case 0x66:
        option_force = 1;
        break;
      case 0x6c:
      case 0x72:
      case 0x78:
        goto switchD_0010ca03_caseD_6c;
      case 0x6d:
        pFVar8 = fopen(util_optarg,"r");
        pFVar4 = _stderr;
        pcVar7 = util_optarg;
        pcVar14 = argv0;
        if (pFVar8 == (FILE *)0x0) {
          piVar9 = __errno_location();
          pcVar10 = strerror(*piVar9);
          fprintf(pFVar4,"%s: couldn\'t open %s for reading: %s\n",pcVar14,pcVar7,pcVar10);
        }
        else {
          anmmap_load(g_anmmap,(FILE *)pFVar8,util_optarg);
          fclose(pFVar8);
        }
        break;
      case 0x6f:
        if (iVar2 == 99) goto LAB_0010cd07;
        option_print_offsets = 1;
        break;
      case 0x73:
        local_70 = fopen(util_optarg,"w");
        pFVar4 = _stderr;
        pcVar7 = util_optarg;
        pcVar14 = argv0;
        if (local_70 == (FILE *)0x0) {
          piVar9 = __errno_location();
          pcVar10 = strerror(*piVar9);
          fprintf(pFVar4,"%s: couldn\'t open %s for writing: %s\n",pcVar14,pcVar7,pcVar10);
          local_70 = (FILE *)0x0;
        }
        break;
      case 0x75:
        if (option_unique_filenames == 0) {
          option_unique_filenames = 1;
        }
        else {
          option_dont_add_offset_border = 1;
        }
        break;
      case 0x76:
        option_verbose = option_verbose + 1;
        break;
      default:
        if (iVar1 != 0x58) goto switchD_0010ca03_caseD_64;
switchD_0010ca03_caseD_6c:
        if (iVar2 != -1) {
          fprintf(_stderr,"%s: More than one mode specified\n",argv0);
          goto LAB_0010cc9b;
        }
        version = parse_version(util_optarg);
        iVar2 = iVar1;
      }
      iVar1 = local_5c;
    } while (argv[util_optind] != (char *)0x0);
    lVar3 = (long)local_5c;
    argv[lVar3] = (char *)0x0;
    if (iVar2 != -1) {
      if ((int)version < 6) {
        if (version != 0) goto LAB_0010cc4d;
        pcVar14 = "%s: version must be specified\n";
LAB_0010cc0d:
        fprintf(_stderr,pcVar14,argv0);
        goto LAB_0010cc6f;
      }
      if ((int)version < 0x5f) {
        if (version - 6 < 0xe) {
LAB_0010cca2:
          if (iVar2 < 0x6c) {
            if (iVar2 == 0x58) {
              list_init(&local_58);
              if (0 < iVar1) {
                lVar15 = 0;
                do {
                  current_input = argv[lVar15];
                  pFVar4 = fopen(current_input,"rb");
                  if (pFVar4 == (FILE *)0x0) goto LAB_0010d03f;
                  paVar6 = anm_read_file((FILE *)pFVar4,version);
                  list_append_new(&local_58,paVar6);
                  fclose(pFVar4);
                  lVar15 = lVar15 + 1;
                } while (lVar3 != lVar15);
                anm_build_name_lists_multiple(&local_58);
                if (local_58.head != (list_node_t *)0x0) {
                  lVar3 = 0;
                  plVar11 = local_58.head;
                  do {
                    plVar16 = *(long **)((long)plVar11->data + 0x20);
                    if (plVar16 != (long *)0x0) {
                      iVar2 = 0;
                      do {
                        paVar12 = (anm_entry_t *)plVar16[2];
                        if (paVar12->processed == 0) {
                          pcVar14 = paVar12->name;
                          current_output = pcVar14;
                          if (option_verbose != 0) {
                            fprintf(_stderr,"%s\n");
                            pcVar14 = paVar12->name;
                          }
                          if (option_unique_filenames == 0) {
LAB_0010d23a:
                            pcVar7 = (char *)0x0;
                          }
                          else {
                            pcVar14 = anm_make_unique_filename(pcVar14,argv[lVar3],iVar2);
                            pcVar7 = pcVar14;
                            if (pcVar14 == (char *)0x0) {
                              pcVar14 = paVar12->name;
                              goto LAB_0010d23a;
                            }
                          }
                          anm_extract(paVar12,pcVar14,version);
                          free(pcVar7);
                        }
                        iVar2 = iVar2 + 1;
                        plVar16 = (long *)*plVar16;
                      } while (plVar16 != (long *)0x0);
                    }
                    lVar3 = lVar3 + 1;
                    plVar11 = plVar11->next;
                    plVar13 = local_58.head;
                  } while (plVar11 != (list_node_t *)0x0);
                  for (; plVar13 != (list_node_t *)0x0; plVar13 = plVar13->next) {
                    anm_free((anm_archive_t *)plVar13->data);
                  }
                }
                list_free_nodes(&local_58);
                goto LAB_0010cfef;
              }
            }
            else if ((iVar2 == 99) && (local_5c == 2)) {
              current_input = argv[1];
              paVar6 = anm_create(current_input,(FILE *)local_70,version);
              if (local_70 != (FILE *)0x0) {
                fclose(local_70);
              }
              if (paVar6 == (anm_archive_t *)0x0) goto LAB_0010cfef;
              anm_defaults(paVar6,version);
              if (option_unique_filenames == 0) {
                anm_build_name_lists(paVar6);
              }
              plVar11 = (paVar6->entries).head;
              if (plVar11 != (list_node_t *)0x0) {
                do {
                  plVar16 = (long *)plVar11->data;
                  if ((*(short *)(*plVar16 + 0x34) != 0) && (plVar16[0xb] == 0)) {
                    pvVar5 = calloc(1,(ulong)*(uint *)(plVar16[1] + 0xc));
                    plVar16[0xb] = (long)pvVar5;
                  }
                  plVar11 = plVar11->next;
                } while (plVar11 != (list_node_t *)0x0);
                for (plVar11 = (paVar6->entries).head; plVar11 != (list_node_t *)0x0;
                    plVar11 = plVar11->next) {
                  paVar12 = (anm_entry_t *)plVar11->data;
                  if (paVar12->processed == 0) {
                    pcVar14 = paVar12->filename;
                    if (pcVar14 == (char *)0x0) {
                      pcVar14 = paVar12->name;
                    }
                    anm_replace(paVar6,(FILE *)0x0,paVar12,pcVar14,version);
                  }
                }
              }
              current_output = *argv;
              anm_write(paVar6,current_output,version);
LAB_0010cfea:
              anm_free(paVar6);
LAB_0010cfef:
              exit(0);
            }
          }
          else if (iVar2 == 0x78) {
            if (0 < local_5c) {
              current_input = *argv;
              pFVar4 = fopen(current_input,"rb");
              if (pFVar4 != (FILE *)0x0) {
                paVar6 = anm_read_file((FILE *)pFVar4,version);
                fclose(pFVar4);
                if (option_unique_filenames == 0) {
                  anm_build_name_lists(paVar6);
                }
                if (iVar1 == 1) {
                  plVar11 = (paVar6->entries).head;
                  if (plVar11 != (list_node_t *)0x0) {
                    iVar2 = 0;
                    do {
                      paVar12 = (anm_entry_t *)plVar11->data;
                      if (paVar12->processed == 0) {
                        pcVar14 = paVar12->name;
                        current_output = pcVar14;
                        if (option_verbose != 0) {
                          fprintf(_stderr,"%s\n");
                          pcVar14 = paVar12->name;
                        }
                        if (option_unique_filenames == 0) {
LAB_0010d2fa:
                          pcVar7 = (char *)0x0;
                        }
                        else {
                          pcVar14 = anm_make_unique_filename(pcVar14,*argv,iVar2);
                          pcVar7 = pcVar14;
                          if (pcVar14 == (char *)0x0) {
                            pcVar14 = paVar12->name;
                            goto LAB_0010d2fa;
                          }
                        }
                        anm_extract(paVar12,pcVar14,version);
                        free(pcVar7);
                      }
                      iVar2 = iVar2 + 1;
                      plVar11 = plVar11->next;
                    } while (plVar11 != (list_node_t *)0x0);
                  }
                }
                else {
                  lVar15 = 1;
                  do {
                    plVar11 = (paVar6->entries).head;
                    if (plVar11 != (list_node_t *)0x0) {
                      iVar2 = 0;
                      do {
                        paVar12 = (anm_entry_t *)plVar11->data;
                        if (paVar12->processed == 0) {
                          pcVar14 = paVar12->name;
                          iVar1 = strcmp(argv[lVar15],pcVar14);
                          if (iVar1 == 0) {
                            current_output = pcVar14;
                            if (option_verbose != 0) {
                              fprintf(_stderr,"%s\n",pcVar14);
                              pcVar14 = paVar12->name;
                            }
                            if (option_unique_filenames == 0) {
LAB_0010d106:
                              pcVar7 = (char *)0x0;
                            }
                            else {
                              pcVar7 = anm_make_unique_filename(pcVar14,*argv,iVar2);
                              pcVar14 = pcVar7;
                              if (pcVar7 == (char *)0x0) {
                                pcVar14 = paVar12->name;
                                goto LAB_0010d106;
                              }
                            }
                            anm_extract(paVar12,pcVar14,version);
                            free(pcVar7);
                          }
                        }
                        iVar2 = iVar2 + 1;
                        plVar11 = plVar11->next;
                      } while (plVar11 != (list_node_t *)0x0);
                    }
                    fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,
                            argv[lVar15]);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != lVar3);
                }
                goto LAB_0010cfea;
              }
              goto LAB_0010d03f;
            }
          }
          else if (iVar2 == 0x72) {
            if (local_5c == 3) {
              if (version == 0x13) {
                pcVar14 = "%s: -r doesn\'t work with th19\n";
                goto LAB_0010cc0d;
              }
              current_output = argv[2];
              current_input = *argv;
              pFVar4 = fopen(current_input,"rb");
              if (pFVar4 != (FILE *)0x0) {
                paVar6 = anm_read_file((FILE *)pFVar4,version);
                fclose(pFVar4);
                pFVar8 = fopen(*argv,"rb+");
                pFVar4 = _stderr;
                pcVar7 = current_input;
                pcVar14 = argv0;
                if (pFVar8 == (FILE *)0x0) {
                  piVar9 = __errno_location();
                  pcVar10 = strerror(*piVar9);
                  fprintf(pFVar4,"%s: couldn\'t open %s for writing: %s\n",pcVar14,pcVar7,pcVar10);
                  goto LAB_0010cc6f;
                }
                anm_build_name_lists(paVar6);
                plVar11 = (list_node_t *)&paVar6->names;
                do {
                  plVar11 = plVar11->next;
                  if (plVar11 == (list_node_t *)0x0) {
                    fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[1]);
                    goto LAB_0010d3b2;
                  }
                  pcVar14 = (char *)plVar11->data;
                  iVar2 = strcmp(argv[1],pcVar14);
                } while (iVar2 != 0);
                plVar11 = (list_node_t *)&paVar6->entries;
                do {
                  plVar11 = plVar11->next;
                  if (plVar11 == (list_node_t *)0x0) {
                    paVar12 = (anm_entry_t *)0x0;
                    break;
                  }
                  paVar12 = (anm_entry_t *)plVar11->data;
                } while (paVar12->name != pcVar14);
                anm_replace(paVar6,(FILE *)pFVar8,paVar12,argv[2],version);
LAB_0010d3b2:
                fclose(pFVar8);
                goto LAB_0010cfea;
              }
              goto LAB_0010d03f;
            }
          }
          else if ((iVar2 == 0x6c) && (local_5c == 1)) {
            current_input = *argv;
            pFVar4 = fopen(current_input,"rb");
            if (pFVar4 != (FILE *)0x0) {
              paVar6 = anm_read_file((FILE *)pFVar4,version);
              fclose(pFVar4);
              anm_dump(_stdout,paVar6,version,*argv);
              goto LAB_0010cfea;
            }
LAB_0010d03f:
            fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
            goto LAB_0010cc6f;
          }
          goto LAB_0010cc9b;
        }
      }
      else if ((((version - 0x5f < 0x31) &&
                ((0x1000240000101U >> ((ulong)(version - 0x5f) & 0x3f) & 1) != 0)) ||
               (version == 0xa5)) || (version == 0xb9)) goto LAB_0010cca2;
LAB_0010cc4d:
      fprintf(_stderr,"%s: version %u is unsupported\n",argv0);
      goto LAB_0010cc6f;
    }
  }
LAB_0010cc9b:
  print_usage();
LAB_0010cc6f:
  exit(1);
}

Assistant:

int
main(
    int argc,
    char* argv[])
{
    g_anmmap = anmmap_new();
    atexit(free_globals);

    const char commands[] = ":l:om:"
#ifdef HAVE_LIBPNG
                            "x:X:r:c:s:"
#endif
                            "Vfuv";
    int command = -1;

    FILE* in;
    unsigned version = 0;

    anm_archive_t* anm;
#ifdef HAVE_LIBPNG
    anm_entry_t* entry;
    char* name;

    FILE* anmfp;
    FILE* symbolfp = NULL;
    int i;
#endif

    argv0 = util_shortname(argv[0]);
    int opt;
    int ind = 0;
    while(argv[util_optind]) {
        switch(opt = util_getopt(argc,argv,commands)) {
        case 'c':
            if (option_print_offsets) {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            /* fallthrough */
        case 'l':
        case 'x':
        case 'X':
        case 'r':
            if(command != -1) {
                fprintf(stderr,"%s: More than one mode specified\n",argv0);
                print_usage();
                exit(1);
            }
            command = opt;
            version = parse_version(util_optarg);
            break;
        case 'm': {
            FILE* map_file = NULL;
            map_file = fopen(util_optarg, "r");
            if (!map_file) {
                fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
                    argv0, util_optarg, strerror(errno));
            } else {
                anmmap_load(g_anmmap, map_file, util_optarg);
                fclose(map_file);
            }
            break;
        }
        case 's':
            symbolfp = fopen(util_optarg, "w");
            if (!symbolfp) {
                fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                    argv0, util_optarg, strerror(errno));
            }
            break;
        case 'f':
            option_force = 1;
            break;
        case 'u':
            if (option_unique_filenames)
                option_dont_add_offset_border = 1;
            else
                option_unique_filenames = 1;
            break;
        case 'v':
            option_verbose++;
            break;
        case 'o':
            if (command == 'c') {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            option_print_offsets = 1;
            break;
        default:
            util_getopt_default(&ind,argv,opt,print_usage);
        }
    }
    argc = ind;
    argv[argc] = NULL;

    if (command == -1) {
        print_usage();
        exit(1);
    }

    switch (version) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 95:
    case 10:
    case 103:
    case 11:
    case 125:
    case 128:
    case 12:
    case 13:
    case 143:
    case 14:
    case 15:
    case 165:
    case 16:
    case 17:
    case 185:
    case 18:
    case 19:
    /* NEWHU: 19 */
        break;
    default:
        if (version == 0)
            fprintf(stderr, "%s: version must be specified\n", argv0);
        else
            fprintf(stderr, "%s: version %u is unsupported\n", argv0, version);
        exit(1);
    }

    switch (command) {
    case 'l':
        if (argc != 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);
        anm_dump(stdout, anm, version, argv[0]);

        anm_free(anm);
        exit(0);
#ifdef HAVE_LIBPNG
    case 'x':
        if (argc < 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        if (!option_unique_filenames)
            anm_build_name_lists(anm);

        if (argc == 1) {
            /* Extract all files. */
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[0], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
        } else {
            /* Extract all listed files. */
            for (i = 1; i < argc; ++i) {
                int j = 0;
                list_for_each(&anm->entries, entry) {
                    if (!entry->processed) {
                        if (strcmp(argv[i], entry->name) == 0) {
                            char *filename = 0;
                            current_output = entry->name;
                            if (option_verbose >= 1)
                                fprintf(stderr, "%s\n", entry->name);
                            if (option_unique_filenames)
                                filename = anm_make_unique_filename(entry->name, argv[0], j);
                            anm_extract(entry, filename ? filename : entry->name, version);
                            free(filename);
                            /* unfortunately we can't just skip to next argv, because of possible duplicates */
                        }
                    }
                    j++;
                }
                fprintf(stderr, "%s:%s: %s not found in archive\n",
                    argv0, current_input, argv[i]);
            }
        }

        anm_free(anm);
        exit(0);
    case 'X': {
        list_t anms;
        list_init(&anms);

        if (argc < 1) {
            print_usage();
            exit(1);
        }

        for (i = 0; i < argc; ++i) {
            current_input = argv[i];
            in = fopen(argv[i], "rb");
            if (!in) {
                fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
                exit(1);
            }
            anm = anm_read_file(in, version);
            list_append_new(&anms, anm);
            fclose(in);
        }

        anm_build_name_lists_multiple(&anms);

        i = 0;
        list_for_each(&anms, anm) {
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[i], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
            i++;
        }

        list_for_each(&anms, anm)
            anm_free(anm);
        list_free_nodes(&anms);
        exit(0);
    }
    case 'r':
        if (argc != 3) {
            print_usage();
            exit(1);
        }

        if (version == 19) {
            /* NEWHU: 19 */ /* FIXME: */
            fprintf(stderr, "%s: -r doesn't work with th19\n", argv0);
            exit(1);
        }

        current_output = argv[2];
        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        anmfp = fopen(argv[0], "rb+");
        if (!anmfp) {
            fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, current_input, strerror(errno));
            exit(1);
        }

        anm_build_name_lists(anm);
        list_for_each(&anm->names, name) {
            if (strcmp(argv[1], name) == 0) {
                anm_replace(anm, anmfp, util_entry_by_name(anm, name), argv[2], version);
                goto replace_done;
            }
        }

        fprintf(stderr, "%s:%s: %s not found in archive\n",
            argv0, current_input, argv[1]);

replace_done:

        fclose(anmfp);

#if 0
        offset = 0;
        list_for_each(&anm->entries, entry) {
            unsigned int nextoffset = entry->header->nextoffset;
            if (strcmp(argv[1], entry->name) == 0 && entry->header->hasdata) {
                if (!file_seek(anmfp,
                    offset + entry->header->thtxoffset + 4 + sizeof(thtx_header_t)))
                    exit(1);
                if (!file_write(anmfp, entry->data, entry->thtx->size))
                    exit(1);
            }
            offset += nextoffset;
        }
#endif

        anm_free(anm);
        exit(0);
    case 'c':
        if (argc != 2) {
            print_usage();
            exit(1);
        }
        current_input = argv[1];
        anm = anm_create(argv[1], symbolfp, version);

        if (symbolfp)
            fclose(symbolfp);

        if (anm == NULL)
            exit(0);

        anm_defaults(anm, version);

        /* Allocate enough space for the THTX data. */
        if (!option_unique_filenames)
            anm_build_name_lists(anm);
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && !entry->data) {
                /* XXX: There are a few entries with a thtx.size greater than
                 *      w*h*Bpp.  The extra data appears to be all zeroes. */
                entry->data = calloc(1, entry->thtx->size);
            }
        }
        list_for_each(&anm->entries, entry) {
            if (!entry->processed)
                anm_replace(anm, NULL, entry, entry->filename ? entry->filename : entry->name, version);
        }

        current_output = argv[0];
        anm_write(anm, argv[0], version);

        anm_free(anm);
        exit(0);
#endif
    default:
        print_usage();
        exit(1);
    }
}